

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Divide<0,_1,_1>::propagate(Divide<0,_1,_1> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  IntVar *pIVar11;
  IntVar *pIVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar12 = (this->x).var;
  pIVar11 = (this->y).var;
  lVar9 = (long)(pIVar12->max).v;
  iVar5 = (pIVar11->max).v;
  lVar15 = (long)(pIVar11->min).v;
  pIVar11 = (this->z).var;
  iVar1 = (pIVar11->max).v;
  lVar10 = -(long)iVar1;
  iVar2 = (pIVar11->min).v;
  lVar14 = -(long)iVar2;
  lVar7 = (long)(pIVar12->min).v + -1;
  lVar16 = -lVar15;
  lVar6 = (lVar7 - lVar15) / lVar16;
  lVar15 = lVar14;
  if (lVar6 != lVar10 && SBORROW8(lVar6,lVar10) == lVar6 + iVar1 < 0) {
    if (so.lazy) {
      iVar3 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[8])(pIVar12);
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      pIVar11 = (this->z).var;
    }
    else {
      uVar8 = 0;
    }
    iVar3 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])(pIVar11,-lVar6,uVar8,1);
    if ((char)iVar3 == '\0') {
      return false;
    }
    pIVar11 = (this->z).var;
    lVar15 = -(long)(pIVar11->min).v;
  }
  lVar13 = -(long)iVar5;
  lVar6 = (lVar13 + lVar9 + -1) / lVar13;
  if (lVar6 < lVar15) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar11 = (this->z).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])(pIVar11,-lVar6,uVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  lVar13 = lVar13 * (lVar10 + -1);
  pIVar12 = (this->x).var;
  if ((pIVar12->min).v <= lVar13) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar12 = (this->x).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,lVar13 + 1,uVar8,1)
    ;
    if ((char)iVar5 == '\0') {
      return false;
    }
    pIVar12 = (this->x).var;
  }
  lVar16 = lVar16 * lVar14;
  if (lVar16 < (pIVar12->max).v) {
    if (so.lazy == true) {
      iVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar12 = (this->x).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])(pIVar12,lVar16,uVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  if (iVar2 < 0) {
    lVar14 = (lVar7 + lVar14) / lVar14;
    pIVar12 = (this->y).var;
    lVar15 = (long)(pIVar12->max).v;
    lVar6 = -lVar15;
    if (lVar14 != lVar6 && SBORROW8(lVar14,lVar6) == lVar14 + lVar15 < 0) {
      if (so.lazy == true) {
        iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
        pIVar12 = (this->y).var;
      }
      else {
        uVar8 = 0;
      }
      iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xf])(pIVar12,-lVar14,uVar8,1);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
  }
  if (-2 < iVar1) {
    return true;
  }
  lVar15 = (lVar9 + lVar10 + -2) / (lVar10 + -1);
  pIVar12 = (this->y).var;
  lVar6 = (long)(pIVar12->min).v;
  lVar14 = -lVar6;
  if (lVar15 == lVar14 || SBORROW8(lVar15,lVar14) != lVar15 + lVar6 < 0) {
    if (so.lazy == true) {
      iVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar4 << 0x20 | (long)iVar5 << 2 | 3;
      pIVar12 = (this->y).var;
    }
    else {
      uVar8 = 0;
    }
    iVar5 = (*(pIVar12->super_Var).super_Branching._vptr_Branching[0xe])(pIVar12,1 - lVar15,uVar8,1)
    ;
    if ((char)iVar5 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}